

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

void __thiscall mat_lib::vector<double>::save_as(vector<double> *this,string *file_name)

{
  code *pcVar1;
  ostream *poVar2;
  logic_error *this_00;
  string asStack_3b8 [32];
  ofstream ofs;
  long alStack_390 [3];
  byte abStack_378 [480];
  ostringstream str_stream;
  
  std::ofstream::ofstream(&ofs,(string *)file_name,_S_out);
  if ((abStack_378[*(long *)(_ofs + -0x18)] & 5) == 0) {
    if (this->format__ == fixed) {
      pcVar1 = std::fixed;
    }
    else {
      pcVar1 = std::scientific;
    }
    (*pcVar1)(&ofs + *(long *)(_ofs + -0x18));
    *(long *)((long)alStack_390 + *(long *)(_ofs + -0x18)) = (long)this->fractional_digits__;
    operator<<((ostream *)&ofs,this);
    std::ofstream::~ofstream(&ofs);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str_stream);
  poVar2 = std::operator<<((ostream *)&str_stream,"cannot open file \"");
  poVar2 = std::operator<<(poVar2,(string *)file_name);
  poVar2 = std::operator<<(poVar2,"\"! (");
  poVar2 = std::operator<<(poVar2,"save_as");
  poVar2 = std::operator<<(poVar2,"() in ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/miguel-kjh[P]MatLibraryPy/matrix.hpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x397);
  std::operator<<(poVar2,")");
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::logic_error::logic_error(this_00,asStack_3b8);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void vector<T>::save_as(const string &file_name) const {
        ofstream ofs(file_name);
        if(!ofs)
        {
            ostringstream str_stream;
            str_stream<<"cannot open file \""<<file_name<<"\"! ("
                      <<__func__<<"() in "<<__FILE__<<":"<<__LINE__<<")";
            throw logic_error(str_stream.str());
        }

        auto formatter = format__ == mat_lib::fixed ? std::fixed : std::scientific;
        ofs << formatter << setprecision(fractional_digits__) << *this;
    }